

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::DielectricMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,DielectricMaterial *this,SampledWavelengths *param_3,
          int *param_4,undefined8 param_5,undefined8 param_6,undefined8 param_7,undefined8 param_8,
          undefined8 param_9,undefined8 param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14)

{
  ulong uVar1;
  bool bVar2;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  undefined1 auVar3 [16];
  float __x;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar4;
  uintptr_t iptr;
  undefined1 auVar5 [16];
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 uVar10;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar6 [16];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  UniversalTextureEvaluator local_8d;
  float local_8c;
  Float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  BxDFHandle local_70;
  uintptr_t local_68;
  uintptr_t local_60;
  uintptr_t local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  uVar1 = (this->etaF).
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) == 0) {
    local_58 = (this->etaS).
               super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
               .bits;
    local_48 = *(undefined8 *)(param_3->lambda).values;
    uStack_40 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_38 = *(undefined8 *)(param_3->pdf).values;
    uStack_30 = *(undefined8 *)((param_3->pdf).values + 2);
    ctx_00._8_8_ = param_8;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx_00._32_8_ = param_11;
    ctx_00._40_8_ = param_12;
    ctx_00._48_8_ = param_13;
    ctx_00._56_8_ = param_14;
    uVar10 = param_8;
    SVar11 = UniversalTextureEvaluator::operator()
                       (&local_8d,(SpectrumTextureHandle)&local_58,ctx_00,*param_3);
    local_88 = SVar11.values.values[0];
    fStack_84 = SVar11.values.values[1];
    uStack_80 = (undefined4)uVar10;
    uStack_7c = (undefined4)((ulong)uVar10 >> 0x20);
    SampledWavelengths::TerminateSecondary(param_3);
  }
  else {
    ctx._8_8_ = param_8;
    ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx._32_8_ = param_11;
    ctx._40_8_ = param_12;
    ctx._48_8_ = param_13;
    ctx._56_8_ = param_14;
    local_50 = uVar1;
    local_88 = UniversalTextureEvaluator::operator()(&local_8d,(FloatTextureHandle)&local_50,ctx);
    fStack_84 = extraout_XMM0_Db;
    uStack_80 = extraout_XMM0_Dc;
    uStack_7c = extraout_XMM0_Dd;
  }
  local_60 = (this->uRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_01._8_8_ = param_8;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_01._32_8_ = param_11;
  ctx_01._40_8_ = param_12;
  ctx_01._48_8_ = param_13;
  ctx_01._56_8_ = param_14;
  local_8c = UniversalTextureEvaluator::operator()(&local_8d,(FloatTextureHandle)&local_60,ctx_01);
  local_68 = (this->vRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_02._8_8_ = param_8;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_02._32_8_ = param_11;
  ctx_02._40_8_ = param_12;
  ctx_02._48_8_ = param_13;
  ctx_02._56_8_ = param_14;
  auVar7._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_8d,(FloatTextureHandle)&local_68,ctx_02);
  __x = local_8c;
  auVar7._4_60_ = extraout_var_02;
  auVar5 = auVar7._0_16_;
  uVar4 = extraout_var;
  if (this->remapRoughness == true) {
    if (local_8c < 0.0) {
      local_8c = auVar7._0_4_;
      auVar8._0_4_ = sqrtf(__x);
      auVar8._4_60_ = extraout_var_03;
      auVar5 = ZEXT416((uint)local_8c);
      auVar6 = auVar8._0_16_;
      uVar4 = extraout_var_00;
    }
    else {
      auVar6 = vsqrtss_avx(ZEXT416((uint)local_8c),ZEXT416((uint)local_8c));
    }
    if (auVar5._0_4_ < 0.0) {
      local_8c = auVar6._0_4_;
      auVar9._0_4_ = sqrtf(auVar5._0_4_);
      auVar9._4_60_ = extraout_var_04;
      auVar6 = ZEXT416((uint)local_8c);
      auVar5 = auVar9._0_16_;
      uVar4 = extraout_var_01;
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
    }
  }
  else {
    auVar6 = ZEXT416((uint)local_8c);
  }
  local_70.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_4 | 0x5000000000000);
  auVar6 = vmaxss_avx(auVar6,SUB6416(ZEXT464(0x38d1b717),0));
  auVar5 = vmaxss_avx(auVar5,SUB6416(ZEXT464(0x38d1b717),0));
  auVar3._4_4_ = fStack_84;
  auVar3._0_4_ = local_88;
  auVar3._8_4_ = uStack_80;
  auVar3._12_4_ = uStack_7c;
  uVar10 = vcmpss_avx512f(auVar3,ZEXT416(0x3f800000),0);
  bVar2 = (bool)((byte)uVar10 & 1);
  *param_4 = (uint)bVar2 * 0x3f8020c5 + (uint)!bVar2 * (int)local_88;
  *(ulong *)(param_4 + 1) = CONCAT44(uVar4,auVar6._0_4_) | (ulong)auVar5._0_4_ << 0x20;
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_70,local_88);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda,
                              DielectricInterfaceBxDF *bxdf) const {
        // Compute index of refraction for dielectric material
        Float eta;
        if (etaF)
            eta = texEval(etaF, ctx);
        else {
            eta = texEval(etaS, ctx, lambda)[0];
            lambda.TerminateSecondary();
        }

        // Create microfacet distribution for \use{DielectricMaterial}
        Float urough = texEval(uRoughness, ctx), vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        // Return BSDF for \use{DielectricMaterial}
        *bxdf = DielectricInterfaceBxDF(eta, distrib);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }